

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallExportGenerator::cmInstallExportGenerator
          (cmInstallExportGenerator *this,cmExportSet *exportSet,char *destination,
          char *file_permissions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,char *component,MessageLevel message,bool exclude_from_all,char *filename,
          char *name_space,bool exportOld,bool android)

{
  cmExportInstallFileGenerator *this_00;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,destination,configurations,component,message,
             exclude_from_all);
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallExportGenerator_005d1678;
  this->ExportSet = exportSet;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->FilePermissions,file_permissions,&local_31);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->FileName,filename,&local_32);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->Namespace,name_space,&local_33);
  this->ExportOld = exportOld;
  this->LocalGenerator = (cmLocalGenerator *)0x0;
  (this->TempDir)._M_dataplus._M_p = (pointer)&(this->TempDir).field_2;
  (this->TempDir)._M_string_length = 0;
  (this->TempDir).field_2._M_local_buf[0] = '\0';
  (this->MainImportFile)._M_dataplus._M_p = (pointer)&(this->MainImportFile).field_2;
  (this->MainImportFile)._M_string_length = 0;
  (this->MainImportFile).field_2._M_local_buf[0] = '\0';
  if (android) {
    this_00 = (cmExportInstallFileGenerator *)operator_new(0x138);
    cmExportInstallAndroidMKGenerator::cmExportInstallAndroidMKGenerator
              ((cmExportInstallAndroidMKGenerator *)this_00,this);
  }
  else {
    this_00 = (cmExportInstallFileGenerator *)operator_new(0x138);
    cmExportInstallFileGenerator::cmExportInstallFileGenerator(this_00,this);
  }
  this->EFGen = this_00;
  cmExportSet::AddInstallation(exportSet,this);
  return;
}

Assistant:

cmInstallExportGenerator::cmInstallExportGenerator(
  cmExportSet* exportSet, const char* destination,
  const char* file_permissions, std::vector<std::string> const& configurations,
  const char* component, MessageLevel message, bool exclude_from_all,
  const char* filename, const char* name_space, bool exportOld, bool android)
  : cmInstallGenerator(destination, configurations, component, message,
                       exclude_from_all)
  , ExportSet(exportSet)
  , FilePermissions(file_permissions)
  , FileName(filename)
  , Namespace(name_space)
  , ExportOld(exportOld)
  , LocalGenerator(nullptr)
{
  if (android) {
#ifdef CMAKE_BUILD_WITH_CMAKE
    this->EFGen = new cmExportInstallAndroidMKGenerator(this);
#endif
  } else {
    this->EFGen = new cmExportInstallFileGenerator(this);
  }
  exportSet->AddInstallation(this);
}